

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhRecordRemove(lhcell *pCell)

{
  int iVar1;
  pgno local_38;
  pgno iNext;
  unqlite_page *pOvfl;
  lhash_kv_engine *plStack_20;
  int rc;
  lhash_kv_engine *pEngine;
  lhcell *pCell_local;
  
  plStack_20 = pCell->pPage->pHash;
  pEngine = (lhash_kv_engine *)pCell;
  if (pCell->iOvfl != 0) {
    local_38 = pCell->iOvfl;
    do {
      pOvfl._4_4_ = (*plStack_20->pIo->xGet)
                              (plStack_20->pIo->pHandle,local_38,(unqlite_page **)&iNext);
      if (pOvfl._4_4_ != 0) {
        return pOvfl._4_4_;
      }
      SyBigEndianUnpack64(*(uchar **)iNext,&local_38);
      pOvfl._4_4_ = lhRestorePage(plStack_20,(unqlite_page *)iNext);
      if (pOvfl._4_4_ != 0) {
        return pOvfl._4_4_;
      }
      (*plStack_20->pIo->xPageUnref)((unqlite_page *)iNext);
    } while (local_38 != 0);
  }
  iVar1 = lhUnlinkCell((lhcell *)pEngine);
  return iVar1;
}

Assistant:

static int lhRecordRemove(lhcell *pCell)
{
	lhash_kv_engine *pEngine = pCell->pPage->pHash;
	int rc;
	if( pCell->iOvfl > 0){
		/* Discard overflow pages */
		unqlite_page *pOvfl;
		pgno iNext = pCell->iOvfl;
		for(;;){
			/* Point to the overflow page */
			rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,iNext,&pOvfl);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			/* Next page on the chain */
			SyBigEndianUnpack64(pOvfl->zData,&iNext);
			/* Restore the page to the free list */
			rc = lhRestorePage(pEngine,pOvfl);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			/* Unref */
			pEngine->pIo->xPageUnref(pOvfl);
			if( iNext == 0 ){
				break;
			}
		}
	}
	/* Unlink the cell */
	rc = lhUnlinkCell(pCell);
	return rc;
}